

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_attr_set_float(exr_context_t ctxt,int part_index,char *name,float val)

{
  int iVar1;
  exr_result_t eVar2;
  exr_attribute_list_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  undefined4 in_XMM0_Da;
  exr_attribute_list_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_attribute_t **in_stack_00000020;
  exr_result_t rv;
  exr_attribute_t *attr;
  int local_34;
  undefined8 in_stack_ffffffffffffffd0;
  exr_attribute_t **out;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *p_Var3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_RDX == (exr_attribute_list_t *)0x0) ||
     (iVar1 = strcmp((char *)in_RDX,"pixelAspectRatio"), iVar1 != 0)) {
    if ((in_RDX == (exr_attribute_list_t *)0x0) ||
       (iVar1 = strcmp((char *)in_RDX,"screenWindowWidth"), iVar1 != 0)) {
      out = (exr_attribute_t **)0x0;
      if (in_RDI == (_internal_exr_context *)0x0) {
        local_34 = 2;
      }
      else {
        p_Var3 = in_RDI;
        internal_exr_lock(in_RDI);
        if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
          internal_exr_unlock(in_RDI);
          local_34 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
        }
        else if (in_RDI->mode == '\0') {
          internal_exr_unlock(in_RDI);
          local_34 = (*in_RDI->standard_error)(in_RDI,8);
        }
        else if (in_RDI->mode == '\x03') {
          internal_exr_unlock(in_RDI);
          local_34 = (*in_RDI->standard_error)(in_RDI,0x15);
        }
        else {
          eVar2 = exr_attr_list_find_by_name
                            ((exr_const_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                             (char *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd8),out);
          if (eVar2 == 0xf) {
            if (in_RDI->mode != '\x01') {
              internal_exr_unlock(in_RDI);
              return 0xf;
            }
            local_34 = exr_attr_list_add(in_stack_00000008,unaff_retaddr,
                                         (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                          in_stack_fffffffffffffff8),
                                         (exr_attribute_type_t)((ulong)p_Var3 >> 0x20),
                                         (int32_t)p_Var3,
                                         (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                         in_stack_00000020);
          }
          else {
            if (eVar2 != 0) {
              internal_exr_unlock(in_RDI);
              return eVar2;
            }
            local_34 = 0;
            if (*(int *)((long)out + 0x14) != 8) {
              internal_exr_unlock(in_RDI);
              eVar2 = (*in_RDI->print_error)
                                (in_RDI,0x10,
                                 "\'%s\' requested type \'f\', but stored attributes is type \'%s\'"
                                 ,in_RDX,out[1]);
              return eVar2;
            }
          }
          if (local_34 == 0) {
            *(undefined4 *)(out + 3) = in_XMM0_Da;
          }
          internal_exr_unlock(in_RDI);
        }
      }
    }
    else {
      local_34 = exr_set_screen_window_width
                           ((exr_context_t)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd8),
                            (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                            (float)in_stack_ffffffffffffffd0);
    }
  }
  else {
    local_34 = exr_set_pixel_aspect_ratio
                         ((exr_context_t)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd8),
                          (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                          (float)in_stack_ffffffffffffffd0);
  }
  return local_34;
}

Assistant:

exr_result_t
exr_attr_set_float (
    exr_context_t ctxt, int part_index, const char* name, float val)
{
    if (name && 0 == strcmp (name, EXR_REQ_PAR_STR))
        return exr_set_pixel_aspect_ratio (ctxt, part_index, val);
    if (name && 0 == strcmp (name, EXR_REQ_SCR_WW_STR))
        return exr_set_screen_window_width (ctxt, part_index, val);

    ATTR_SET_IMPL (EXR_ATTR_FLOAT, f);
}